

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O0

void anon_unknown.dwarf_14b0b0::readBadBoundsImage(char *fileName)

{
  int iVar1;
  ostream *poVar2;
  char *in_RDI;
  RgbaInputFile in;
  RgbaInputFile local_48 [64];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"file ");
  poVar2 = std::operator<<(poVar2,local_8);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_48,local_8,iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"version ");
  iVar1 = Imf_3_2::RgbaInputFile::version();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Imf_3_2::RgbaInputFile::~RgbaInputFile(local_48);
  return;
}

Assistant:

void
readBadBoundsImage (const char fileName[])
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    //const Box2i &dw = in.dataWindow();
}